

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

int __thiscall cmCPackDebGenerator::createDeb(cmCPackDebGenerator *this)

{
  cmCPackLog *logger;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  controlValues_00;
  string shLibsFilename;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  char *debianArchiveType;
  char *pcVar7;
  undefined8 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa60;
  string strGenWDIR;
  undefined1 in_stack_fffffffffffffa88;
  allocator<char> local_574;
  allocator<char> local_573;
  allocator<char> local_572;
  allocator<char> local_571;
  undefined1 local_570 [2];
  allocator<char> local_56e;
  allocator<char> local_56d;
  allocator<char> local_56c;
  allocator<char> local_56b;
  allocator<char> local_56a;
  allocator<char> local_569;
  string postinst;
  string shlibsfilename;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  controlValues;
  DebGenerator gen;
  string local_298;
  string postrm;
  string local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  string local_220;
  string local_200;
  string local_1e0 [32];
  string local_1c0;
  string local_1a0 [32];
  string local_180;
  string local_160 [32];
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &controlValues._M_t._M_impl.super__Rb_tree_header._M_header;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       controlValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shlibsfilename,"GEN_CPACK_DEBIAN_PACKAGE_NAME",(allocator<char> *)&postrm);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&shlibsfilename);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,pcVar5,(allocator<char> *)&local_298);
  cmsys::SystemTools::LowerCase((string *)&gen,&strGenWDIR);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&postinst,"Package",(allocator<char> *)&local_258);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&postinst);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&gen);
  std::__cxx11::string::~string((string *)&postinst);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::__cxx11::string::~string((string *)&shlibsfilename);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_VERSION",(allocator<char> *)&shlibsfilename);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,"Version",(allocator<char> *)&postinst);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SECTION",(allocator<char> *)&shlibsfilename);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,"Section",(allocator<char> *)&postinst);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_PRIORITY",(allocator<char> *)&shlibsfilename);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,"Priority",(allocator<char> *)&postinst);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE",
             (allocator<char> *)&shlibsfilename);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,"Architecture",(allocator<char> *)&postinst);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER",(allocator<char> *)&shlibsfilename
            );
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,"Maintainer",(allocator<char> *)&postinst);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION",
             (allocator<char> *)&shlibsfilename);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,"Description",(allocator<char> *)&postinst);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&controlValues,&strGenWDIR);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SOURCE",(allocator<char> *)&strGenWDIR);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Source",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_DEPENDS",(allocator<char> *)&strGenWDIR);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Depends",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS",(allocator<char> *)&strGenWDIR);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Recommends",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS",(allocator<char> *)&strGenWDIR);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Suggests",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE",(allocator<char> *)&strGenWDIR);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Homepage",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS",(allocator<char> *)&strGenWDIR);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Pre-Depends",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_ENHANCES",(allocator<char> *)&strGenWDIR);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Enhances",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_BREAKS",(allocator<char> *)&strGenWDIR);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Breaks",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS",(allocator<char> *)&strGenWDIR);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Conflicts",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_PROVIDES",(allocator<char> *)&strGenWDIR);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Provides",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_REPLACES",(allocator<char> *)&strGenWDIR);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gen,"Replaces",(allocator<char> *)&strGenWDIR);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&controlValues,(key_type *)&gen);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_WDIR",(allocator<char> *)&shlibsfilename);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strGenWDIR,pcVar5,(allocator<char> *)&postinst);
  std::__cxx11::string::~string((string *)&gen);
  std::operator+(&shlibsfilename,&strGenWDIR,"/shlibs");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_PACKAGE_SHLIBS",(allocator<char> *)&postinst);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"CPACK_DEBIAN_PACKAGE_GENERATE_SHLIBS",(allocator<char> *)&postinst);
  bVar1 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&gen);
  if (bVar1 && pcVar5 != (char *)0x0) {
    bVar1 = *pcVar5 != '\0';
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&gen);
  if (bVar1) {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&gen,&shlibsfilename,false,None);
    std::operator<<((ostream *)&gen,pcVar5);
    std::endl<char,std::char_traits<char>>((ostream *)&gen);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gen);
  }
  std::operator+(&postinst,&strGenWDIR,"/postinst");
  std::operator+(&postrm,&strGenWDIR,"/postrm");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_GENERATE_POSTINST",(allocator<char> *)&local_298);
  bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if (bVar2) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&gen,&postinst,false,None)
    ;
    std::operator<<((ostream *)&gen,
                    "#!/bin/sh\n\nset -e\n\nif [ \"$1\" = \"configure\" ]; then\n\tldconfig\nfi\n");
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gen);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gen,"GEN_CPACK_DEBIAN_GENERATE_POSTRM",(allocator<char> *)&local_298);
  bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&gen);
  std::__cxx11::string::~string((string *)&gen);
  if (bVar2) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&gen,&postrm,false,None);
    std::operator<<((ostream *)&gen,
                    "#!/bin/sh\n\nset -e\n\nif [ \"$1\" = \"remove\" ]; then\n\tldconfig\nfi\n");
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gen);
  }
  logger = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"GEN_CPACK_OUTPUT_FILE_NAME",(allocator<char> *)(local_570 + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,pcVar5,(allocator<char> *)(local_570 + 6));
  std::__cxx11::string::string((string *)&local_a0,(string *)&strGenWDIR);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"CPACK_TOPLEVEL_DIRECTORY",(allocator<char> *)(local_570 + 5));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_258);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,pcVar5,(allocator<char> *)(local_570 + 4));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"CPACK_TEMPORARY_DIRECTORY",(allocator<char> *)(local_570 + 3));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,pcVar5,(allocator<char> *)(local_570 + 2));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE",
             (allocator<char> *)(local_570 + 1));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_120);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"GEN_CPACK_DEBIAN_ARCHIVE_TYPE",(allocator<char> *)local_570);
  debianArchiveType = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_140);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60,&controlValues._M_t);
  std::__cxx11::string::string(local_160,(string *)&shlibsfilename);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"GEN_CPACK_DEBIAN_GENERATE_POSTINST",&local_571);
  bVar2 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_180);
  std::__cxx11::string::string(local_1a0,(string *)&postinst);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"GEN_CPACK_DEBIAN_GENERATE_POSTRM",&local_572);
  bVar3 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_1c0);
  std::__cxx11::string::string(local_1e0,(string *)&postrm);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA",&local_573);
  pcVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_200);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION",&local_574);
  bVar4 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_220);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_238,&this->packageFiles);
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = bVar1;
  controlValues_00._M_t._M_impl._0_8_ = &local_60;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._1_7_ = 0;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_160;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ = bVar2;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_7_ = 0;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_1a0;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = bVar3;
  controlValues_00._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_ = 0;
  shLibsFilename._M_string_length._0_1_ = bVar4;
  shLibsFilename._M_dataplus._M_p = pcVar7;
  shLibsFilename._M_string_length._1_7_ = 0;
  shLibsFilename.field_2._M_allocated_capacity = (size_type)&local_238;
  shLibsFilename.field_2._8_8_ = in_stack_fffffffffffffa58;
  anon_unknown.dwarf_fcff5::DebGenerator::DebGenerator
            (&gen,logger,&local_80,&local_a0,&local_c0,&local_e0,pcVar5,debianArchiveType,
             controlValues_00,SUB81(local_1e0,0),shLibsFilename,(bool)in_stack_fffffffffffffa60,
             strGenWDIR,(bool)in_stack_fffffffffffffa88,_local_570,(char *)postinst.field_2._8_8_,
             (bool)shlibsfilename._M_dataplus._M_p._0_1_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )shlibsfilename._8_24_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string(local_160);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_298);
  bVar1 = anon_unknown.dwarf_fcff5::DebGenerator::generate(&gen);
  anon_unknown.dwarf_fcff5::DebGenerator::~DebGenerator(&gen);
  std::__cxx11::string::~string((string *)&postrm);
  std::__cxx11::string::~string((string *)&postinst);
  std::__cxx11::string::~string((string *)&shlibsfilename);
  std::__cxx11::string::~string((string *)&strGenWDIR);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&controlValues._M_t);
  return (uint)bVar1;
}

Assistant:

int cmCPackDebGenerator::createDeb()
{
  std::map<std::string, std::string> controlValues;

  // debian policy enforce lower case for package name
  controlValues["Package"] = cmsys::SystemTools::LowerCase(
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME"));
  controlValues["Version"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");
  controlValues["Section"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SECTION");
  controlValues["Priority"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PRIORITY");
  controlValues["Architecture"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  controlValues["Maintainer"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  controlValues["Description"] =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION");

  const char* debian_pkg_source =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SOURCE");
  if (debian_pkg_source && *debian_pkg_source) {
    controlValues["Source"] = debian_pkg_source;
  }
  const char* debian_pkg_dep =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DEPENDS");
  if (debian_pkg_dep && *debian_pkg_dep) {
    controlValues["Depends"] = debian_pkg_dep;
  }
  const char* debian_pkg_rec =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS");
  if (debian_pkg_rec && *debian_pkg_rec) {
    controlValues["Recommends"] = debian_pkg_rec;
  }
  const char* debian_pkg_sug =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS");
  if (debian_pkg_sug && *debian_pkg_sug) {
    controlValues["Suggests"] = debian_pkg_sug;
  }
  const char* debian_pkg_url =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE");
  if (debian_pkg_url && *debian_pkg_url) {
    controlValues["Homepage"] = debian_pkg_url;
  }
  const char* debian_pkg_predep =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS");
  if (debian_pkg_predep && *debian_pkg_predep) {
    controlValues["Pre-Depends"] = debian_pkg_predep;
  }
  const char* debian_pkg_enhances =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ENHANCES");
  if (debian_pkg_enhances && *debian_pkg_enhances) {
    controlValues["Enhances"] = debian_pkg_enhances;
  }
  const char* debian_pkg_breaks =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_BREAKS");
  if (debian_pkg_breaks && *debian_pkg_breaks) {
    controlValues["Breaks"] = debian_pkg_breaks;
  }
  const char* debian_pkg_conflicts =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS");
  if (debian_pkg_conflicts && *debian_pkg_conflicts) {
    controlValues["Conflicts"] = debian_pkg_conflicts;
  }
  const char* debian_pkg_provides =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PROVIDES");
  if (debian_pkg_provides && *debian_pkg_provides) {
    controlValues["Provides"] = debian_pkg_provides;
  }
  const char* debian_pkg_replaces =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_REPLACES");
  if (debian_pkg_replaces && *debian_pkg_replaces) {
    controlValues["Replaces"] = debian_pkg_replaces;
  }

  const std::string strGenWDIR(this->GetOption("GEN_WDIR"));
  const std::string shlibsfilename = strGenWDIR + "/shlibs";

  const char* debian_pkg_shlibs =
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SHLIBS");
  const bool gen_shibs = this->IsOn("CPACK_DEBIAN_PACKAGE_GENERATE_SHLIBS") &&
    debian_pkg_shlibs && *debian_pkg_shlibs;
  if (gen_shibs) {
    cmGeneratedFileStream out(shlibsfilename);
    out << debian_pkg_shlibs;
    out << std::endl;
  }

  const std::string postinst = strGenWDIR + "/postinst";
  const std::string postrm = strGenWDIR + "/postrm";
  if (this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTINST")) {
    cmGeneratedFileStream out(postinst);
    out << "#!/bin/sh\n\n"
           "set -e\n\n"
           "if [ \"$1\" = \"configure\" ]; then\n"
           "\tldconfig\n"
           "fi\n";
  }
  if (this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTRM")) {
    cmGeneratedFileStream out(postrm);
    out << "#!/bin/sh\n\n"
           "set -e\n\n"
           "if [ \"$1\" = \"remove\" ]; then\n"
           "\tldconfig\n"
           "fi\n";
  }

  DebGenerator gen(
    Logger, this->GetOption("GEN_CPACK_OUTPUT_FILE_NAME"), strGenWDIR,
    this->GetOption("CPACK_TOPLEVEL_DIRECTORY"),
    this->GetOption("CPACK_TEMPORARY_DIRECTORY"),
    this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE"),
    this->GetOption("GEN_CPACK_DEBIAN_ARCHIVE_TYPE"), controlValues, gen_shibs,
    shlibsfilename, this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTINST"), postinst,
    this->IsOn("GEN_CPACK_DEBIAN_GENERATE_POSTRM"), postrm,
    this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA"),
    this->IsSet("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION"),
    packageFiles);

  if (!gen.generate()) {
    return 0;
  }
  return 1;
}